

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  Catch *pCVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  StringRef SVar10;
  
  pcVar7 = ref.m_start;
  pcVar5 = pcVar7;
  pcVar1 = pcVar7;
  if (pcVar7 == (char *)0x0) {
    pcVar2 = (char *)0x0;
    bVar9 = false;
joined_r0x00162f91:
    while ((pcVar3 = pcVar2, pcVar2 < pcVar1 &&
           ((pcVar5 = pcVar1, (ulong)(byte)(this + -1)[(long)pcVar1] < 0x21 &&
            ((0x100002600U >> ((ulong)(byte)(this + -1)[(long)pcVar1] & 0x3f) & 1) != 0))))) {
      pcVar1 = pcVar1 + -1;
      pcVar5 = pcVar2;
    }
  }
  else {
    bVar9 = true;
    pcVar2 = (char *)0x0;
    do {
      if ((0x20 < (ulong)(byte)this[(long)pcVar2]) ||
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar2] & 0x3f) & 1) == 0))
      goto joined_r0x00162f91;
      pcVar2 = pcVar2 + 1;
      bVar9 = pcVar2 < pcVar7;
      pcVar3 = pcVar7;
    } while (pcVar2 != pcVar7);
  }
  uVar8 = (long)pcVar7 - (long)pcVar3;
  if ((ulong)((long)pcVar5 - (long)pcVar3) <= (ulong)((long)pcVar7 - (long)pcVar3)) {
    uVar8 = (long)pcVar5 - (long)pcVar3;
  }
  uVar6 = 0;
  if (bVar9) {
    uVar6 = uVar8;
  }
  pCVar4 = (Catch *)0x1a6faf;
  if (bVar9) {
    pCVar4 = this + (long)pcVar3;
  }
  SVar10.m_size = uVar6;
  SVar10.m_start = (char *)pCVar4;
  return SVar10;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }